

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O0

void __thiscall QPDFMatrix::translate(QPDFMatrix *this,double tx,double ty)

{
  QPDFMatrix local_50;
  double local_20;
  double ty_local;
  double tx_local;
  QPDFMatrix *this_local;
  
  local_20 = ty;
  ty_local = tx;
  tx_local = (double)this;
  QPDFMatrix(&local_50,1.0,0.0,0.0,1.0,tx,ty);
  concat(this,&local_50);
  return;
}

Assistant:

void
QPDFMatrix::translate(double tx, double ty)
{
    concat(QPDFMatrix(1, 0, 0, 1, tx, ty));
}